

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::Dimension::MergeFrom(Dimension *this,Dimension *from)

{
  LogMessage *other;
  Dimension_UnknownDimension *this_00;
  Dimension_ConstantDimension *this_01;
  undefined1 *puVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/MIL.pb.cc"
               ,0x1406);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  if (from->_oneof_case_[0] == 1) {
    this_01 = _internal_mutable_constant(this);
    if (from->_oneof_case_[0] == 1) {
      puVar1 = (undefined1 *)(from->dimension_).constant_;
    }
    else {
      puVar1 = _Dimension_ConstantDimension_default_instance_;
    }
    Dimension_ConstantDimension::MergeFrom(this_01,(Dimension_ConstantDimension *)puVar1);
  }
  else if (from->_oneof_case_[0] == 2) {
    this_00 = _internal_mutable_unknown(this);
    if (from->_oneof_case_[0] == 2) {
      puVar1 = (undefined1 *)(from->dimension_).unknown_;
    }
    else {
      puVar1 = _Dimension_UnknownDimension_default_instance_;
    }
    Dimension_UnknownDimension::MergeFrom(this_00,(Dimension_UnknownDimension *)puVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void Dimension::MergeFrom(const Dimension& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.Dimension)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.dimension_case()) {
    case kConstant: {
      _internal_mutable_constant()->::CoreML::Specification::MILSpec::Dimension_ConstantDimension::MergeFrom(from._internal_constant());
      break;
    }
    case kUnknown: {
      _internal_mutable_unknown()->::CoreML::Specification::MILSpec::Dimension_UnknownDimension::MergeFrom(from._internal_unknown());
      break;
    }
    case DIMENSION_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}